

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

View * __thiscall gimage::View::operator=(View *this,View *v)

{
  Camera *pCVar1;
  
  if (this != v) {
    if (this->camera != (Camera *)0x0) {
      (**(code **)(*(long *)this->camera + 8))();
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=(&this->image,&v->image);
    Image<float,_gimage::PixelTraits<float>_>::operator=(&this->depth,&v->depth);
    pCVar1 = (Camera *)(**(code **)(*(long *)v->camera + 0x10))();
    this->camera = pCVar1;
  }
  return this;
}

Assistant:

View &View::operator=(const View &v)
{
  if (this != &v)
  {
    delete camera;

    image=v.image;
    depth=v.depth;
    camera=v.getCamera()->clone();
  }

  return *this;
}